

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcTriangleFans.h
# Opt level: O1

O3DGCErrorCode __thiscall
o3dgc::TriangleFans::Allocate(TriangleFans *this,long sizeTFAN,long verticesSize)

{
  long *plVar1;
  ulong uVar2;
  
  if (sizeTFAN < 1) {
    __assert_fail("sizeTFAN > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/../contrib/Open3DGC/o3dgcTriangleFans.h"
                  ,0xc0,"O3DGCErrorCode o3dgc::TriangleFans::Allocate(long, long)");
  }
  if (0 < verticesSize) {
    this->m_numTFANs = 0;
    this->m_numVertices = 0;
    if (this->m_verticesAllocatedSize < verticesSize) {
      if (this->m_vertices != (long *)0x0) {
        operator_delete__(this->m_vertices);
      }
      this->m_verticesAllocatedSize = verticesSize;
      uVar2 = 0xffffffffffffffff;
      if ((ulong)verticesSize < 0x2000000000000000) {
        uVar2 = verticesSize * 8;
      }
      plVar1 = (long *)operator_new__(uVar2);
      this->m_vertices = plVar1;
    }
    if (this->m_sizeTFANAllocatedSize < sizeTFAN) {
      if (this->m_sizeTFAN != (long *)0x0) {
        operator_delete__(this->m_sizeTFAN);
      }
      this->m_sizeTFANAllocatedSize = sizeTFAN;
      uVar2 = 0xffffffffffffffff;
      if ((ulong)sizeTFAN < 0x2000000000000000) {
        uVar2 = sizeTFAN * 8;
      }
      plVar1 = (long *)operator_new__(uVar2);
      this->m_sizeTFAN = plVar1;
    }
    return O3DGC_OK;
  }
  __assert_fail("verticesSize > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/../contrib/Open3DGC/o3dgcTriangleFans.h"
                ,0xc1,"O3DGCErrorCode o3dgc::TriangleFans::Allocate(long, long)");
}

Assistant:

O3DGCErrorCode                Allocate(long sizeTFAN, long verticesSize)
                                    {
                                        assert(sizeTFAN     > 0);
                                        assert(verticesSize > 0);
                                        m_numTFANs    = 0;
                                        m_numVertices = 0;
                                        if (m_verticesAllocatedSize < verticesSize)
                                        {
                                            delete [] m_vertices;
                                            m_verticesAllocatedSize = verticesSize;
                                            m_vertices              = new long [m_verticesAllocatedSize];
                                        }
                                        if (m_sizeTFANAllocatedSize < sizeTFAN)
                                        {
                                            delete [] m_sizeTFAN;
                                            m_sizeTFANAllocatedSize = sizeTFAN;
                                            m_sizeTFAN              = new long [m_sizeTFANAllocatedSize];
                                        }
                                        return O3DGC_OK;
                                    }